

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

void __thiscall CLI::Option_group::~Option_group(Option_group *this)

{
  Option_group *this_local;
  
  App::~App(&this->super_App);
  return;
}

Assistant:

Option_group(std::string group_description, std::string group_name, App *parent)
        : App(std::move(group_description), "", parent) {
        group(group_name);
        // option groups should have automatic fallthrough
        if(group_name.empty() || group_name.front() == '+') {
            // help will not be used by default in these contexts
            set_help_flag("");
            set_help_all_flag("");
        }
    }